

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall
cmFindPackageCommand::InitialPass
          (cmFindPackageCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  size_t *this_00;
  pointer *this_01;
  cmMakefile *pcVar1;
  cmExecutionStatus *pcVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  size_type sVar6;
  char *pcVar7;
  cmState *this_02;
  const_reference pvVar8;
  long lVar9;
  ostream *poVar10;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __result;
  reference puVar11;
  ulong uVar12;
  undefined8 uVar13;
  reference pbVar14;
  iterator __first;
  iterator __last;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar15;
  bool local_1412;
  bool local_12e1;
  bool local_1171;
  bool result;
  undefined1 local_1100 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignored;
  undefined1 local_10c8 [8];
  string config;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_10a0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1098;
  const_iterator ni;
  string local_1070;
  string local_1050;
  undefined1 local_1030 [8];
  ostringstream aw;
  allocator local_eb1;
  string local_eb0;
  bool local_e89;
  undefined1 local_e88 [7];
  bool foundModule;
  undefined1 local_e68 [8];
  ostringstream e_4;
  allocator local_ce9;
  undefined1 local_ce8 [8];
  string disableFindPackageVar;
  uint parsed_tweak;
  uint parsed_patch;
  uint parsed_minor;
  uint parsed_major;
  string components_var;
  string exact;
  string ver;
  string mod;
  string local_c30;
  string local_c10;
  _Self local_bf0;
  _Self local_be8;
  const_iterator si_1;
  _Self local_bd8;
  const_iterator si;
  ostringstream e_3;
  string local_a58;
  allocator local_a31;
  string local_a30;
  allocator local_a09;
  string local_a08;
  allocator local_9e1;
  string local_9e0;
  string local_9c0;
  undefined1 local_9a0 [8];
  ostringstream e_2;
  undefined1 local_7f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  doubledComponents;
  undefined1 local_7c0 [8];
  ostringstream e_1;
  string local_640;
  undefined1 local_620 [8];
  ostringstream e;
  string local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  undefined1 local_460 [8];
  string req_var;
  char *local_420;
  char *isRequired;
  value_type_conflict3 local_354;
  undefined1 local_350 [4];
  uint i;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> moduleArgs;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> configArgs;
  undefined1 local_2e8 [7];
  bool haveVersion;
  RegularExpression version;
  Doing doing;
  undefined1 local_1f0 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optionalComponents;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  requiredComponents;
  char *components_sep;
  string components;
  string local_160;
  allocator local_139;
  string local_138;
  byte local_113;
  byte local_112;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  char *local_c8;
  char *arch;
  string local_b8;
  int local_98;
  uint local_94;
  uint v [3];
  char *rv;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_3_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFindPackageCommand *this_local;
  
  local_28 = param_2;
  param_3_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar6 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError((cmCommand *)this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_00737d90;
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(v + 2),"CMAKE_MINIMUM_REQUIRED_VERSION",(allocator *)((long)v + 7));
  pcVar7 = cmMakefile::GetDefinition(pcVar1,(string *)(v + 2));
  std::__cxx11::string::~string((string *)(v + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)v + 7));
  if (pcVar7 != (char *)0x0) {
    memset(&local_98,0,0xc);
    __isoc99_sscanf(pcVar7,"%u.%u.%u",&local_98,&local_94,v);
    this->RequiredCMakeVersion =
         (ulong)(uint)(local_98 * 1000) * 100000000 + ((ulong)local_94 % 1000) * 100000000 +
         (ulong)v[0] % 100000000;
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b8,"CMAKE_FIND_DEBUG_MODE",(allocator *)((long)&arch + 7));
  bVar3 = cmMakefile::IsOn(pcVar1,&local_b8);
  this->DebugMode = bVar3;
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&arch + 7));
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"CMAKE_LIBRARY_ARCHITECTURE",&local_e9);
  pcVar7 = cmMakefile::GetDefinition(pcVar1,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  local_c8 = pcVar7;
  if (pcVar7 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->LibraryArchitecture,pcVar7);
  }
  bVar3 = cmMakefile::PlatformIs64Bit((this->super_cmFindCommon).super_cmCommand.Makefile);
  local_112 = 0;
  local_113 = 0;
  local_1171 = false;
  if (bVar3) {
    this_02 = cmMakefile::GetState((this->super_cmFindCommon).super_cmCommand.Makefile);
    std::allocator<char>::allocator();
    local_112 = 1;
    std::__cxx11::string::string((string *)&local_110,"FIND_LIBRARY_USE_LIB64_PATHS",&local_111);
    local_113 = 1;
    local_1171 = cmState::GetGlobalPropertyAsBool(this_02,&local_110);
  }
  if ((local_113 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_110);
  }
  if ((local_112 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
  }
  if (local_1171 != false) {
    this->UseLib64Paths = true;
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_138,"CMAKE_FIND_PACKAGE_NO_PACKAGE_REGISTRY",&local_139);
  bVar3 = cmMakefile::IsOn(pcVar1,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  if (bVar3) {
    this->NoUserRegistry = true;
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_160,"CMAKE_FIND_PACKAGE_NO_SYSTEM_PACKAGE_REGISTRY",
             (allocator *)(components.field_2._M_local_buf + 0xf));
  bVar3 = cmMakefile::IsOn(pcVar1,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)(components.field_2._M_local_buf + 0xf));
  if (bVar3) {
    this->NoSystemRegistry = true;
  }
  cmFindCommon::SelectDefaultRootPathMode(&this->super_cmFindCommon);
  cmFindCommon::SelectDefaultMacMode(&this->super_cmFindCommon);
  pvVar8 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_3_local,0);
  std::__cxx11::string::operator=((string *)&this->Name,(string *)pvVar8);
  std::__cxx11::string::string((string *)&components_sep);
  requiredComponents._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (long)"user=%s\x01auth=Bearer %s\x01\x01" + 0x18;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&optionalComponents._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_1f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&doing,"",(allocator *)((long)&version.searchstring + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->super_cmFindCommon).SearchPathSuffixes,(value_type *)&doing);
  std::__cxx11::string::~string((string *)&doing);
  std::allocator<char>::~allocator((allocator<char> *)((long)&version.searchstring + 7));
  version.searchstring._0_4_ = 0;
  cmsys::RegularExpression::RegularExpression((RegularExpression *)local_2e8,"^[0-9.]+$");
  bVar3 = false;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &moduleArgs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_350)
  ;
  for (local_354 = 1; uVar12 = (ulong)local_354,
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_3_local), uVar12 < sVar6; local_354 = local_354 + 1) {
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_3_local,(ulong)local_354);
    bVar4 = std::operator==(pvVar8,"QUIET");
    if (bVar4) {
      this->Quiet = true;
      version.searchstring._0_4_ = 0;
    }
    else {
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_3_local,(ulong)local_354);
      bVar4 = std::operator==(pvVar8,"EXACT");
      if (bVar4) {
        this->VersionExact = true;
        version.searchstring._0_4_ = 0;
      }
      else {
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_3_local,(ulong)local_354);
        bVar4 = std::operator==(pvVar8,"MODULE");
        if (bVar4) {
          std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_350,&local_354);
          version.searchstring._0_4_ = 0;
        }
        else {
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_3_local,(ulong)local_354);
          bVar4 = std::operator==(pvVar8,"CONFIG");
          if (bVar4) {
            std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &moduleArgs._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_354);
            version.searchstring._0_4_ = 0;
          }
          else {
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_3_local,(ulong)local_354);
            bVar4 = std::operator==(pvVar8,"NO_MODULE");
            if (bVar4) {
              std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&moduleArgs._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_354)
              ;
              version.searchstring._0_4_ = 0;
            }
            else {
              pvVar8 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_3_local,(ulong)local_354);
              bVar4 = std::operator==(pvVar8,"REQUIRED");
              if (bVar4) {
                this->Required = true;
                version.searchstring._0_4_ = 1;
              }
              else {
                pvVar8 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)param_3_local,(ulong)local_354);
                bVar4 = std::operator==(pvVar8,"COMPONENTS");
                if (bVar4) {
                  version.searchstring._0_4_ = 1;
                }
                else {
                  pvVar8 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)param_3_local,(ulong)local_354);
                  bVar4 = std::operator==(pvVar8,"OPTIONAL_COMPONENTS");
                  if (bVar4) {
                    version.searchstring._0_4_ = 2;
                  }
                  else {
                    pvVar8 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)param_3_local,(ulong)local_354);
                    bVar4 = std::operator==(pvVar8,"NAMES");
                    if (bVar4) {
                      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)&moduleArgs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               &local_354);
                      version.searchstring._0_4_ = 3;
                    }
                    else {
                      pvVar8 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)param_3_local,(ulong)local_354);
                      bVar4 = std::operator==(pvVar8,"PATHS");
                      if (bVar4) {
                        std::
                        set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                        insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)&moduleArgs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               &local_354);
                        version.searchstring._0_4_ = 4;
                      }
                      else {
                        pvVar8 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)param_3_local,(ulong)local_354);
                        bVar4 = std::operator==(pvVar8,"HINTS");
                        if (bVar4) {
                          std::
                          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          ::insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                    *)&moduleArgs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                   &local_354);
                          version.searchstring._0_4_ = 7;
                        }
                        else {
                          pvVar8 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)param_3_local,(ulong)local_354);
                          bVar4 = std::operator==(pvVar8,"PATH_SUFFIXES");
                          if (bVar4) {
                            std::
                            set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            ::insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                      *)&moduleArgs._M_t._M_impl.super__Rb_tree_header._M_node_count
                                     ,&local_354);
                            version.searchstring._0_4_ = 5;
                          }
                          else {
                            pvVar8 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                            bVar4 = std::operator==(pvVar8,"CONFIGS");
                            if (bVar4) {
                              std::
                              set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              ::insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                        *)&moduleArgs._M_t._M_impl.super__Rb_tree_header.
                                           _M_node_count,&local_354);
                              version.searchstring._0_4_ = 6;
                            }
                            else {
                              pvVar8 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                              bVar4 = std::operator==(pvVar8,"NO_POLICY_SCOPE");
                              if (bVar4) {
                                this->PolicyScope = false;
                                version.searchstring._0_4_ = 0;
                              }
                              else {
                                pvVar8 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                                bVar4 = std::operator==(pvVar8,"NO_CMAKE_PACKAGE_REGISTRY");
                                if (bVar4) {
                                  this->NoUserRegistry = true;
                                  std::
                                  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                  ::insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                            *)&moduleArgs._M_t._M_impl.super__Rb_tree_header.
                                               _M_node_count,&local_354);
                                  version.searchstring._0_4_ = 0;
                                }
                                else {
                                  pvVar8 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                                  bVar4 = std::operator==(pvVar8,"NO_CMAKE_SYSTEM_PACKAGE_REGISTRY")
                                  ;
                                  if (bVar4) {
                                    this->NoSystemRegistry = true;
                                    std::
                                    set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                    ::insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                              *)&moduleArgs._M_t._M_impl.super__Rb_tree_header.
                                                 _M_node_count,&local_354);
                                    version.searchstring._0_4_ = 0;
                                  }
                                  else {
                                    pvVar8 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                                    bVar4 = std::operator==(pvVar8,"NO_CMAKE_BUILDS_PATH");
                                    if (bVar4) {
                                      std::
                                      set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                      ::insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                                *)&moduleArgs._M_t._M_impl.super__Rb_tree_header.
                                                   _M_node_count,&local_354);
                                      version.searchstring._0_4_ = 0;
                                    }
                                    else {
                                      pvVar8 = std::
                                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                                      bVar4 = cmFindCommon::CheckCommonArgument
                                                        (&this->super_cmFindCommon,pvVar8);
                                      if (bVar4) {
                                        std::
                                        set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                        ::insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                                  *)&moduleArgs._M_t._M_impl.super__Rb_tree_header.
                                                     _M_node_count,&local_354);
                                        version.searchstring._0_4_ = 0;
                                      }
                                      else if (((int)version.searchstring == 1) ||
                                              ((int)version.searchstring == 2)) {
                                        local_420 = "1";
                                        if ((int)version.searchstring == 2) {
                                          local_420 = "0";
                                          pvVar8 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                                          std::
                                          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::insert((
                                                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_1f0,pvVar8);
                                        }
                                        else {
                                          pvVar8 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                                          pVar15 = std::
                                                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::insert((
                                                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&optionalComponents._M_t._M_impl.
                                                     super__Rb_tree_header._M_node_count,pvVar8);
                                          req_var.field_2._8_8_ = pVar15.first._M_node;
                                        }
                                        std::operator+(&local_480,&this->Name,"_FIND_REQUIRED_");
                                        pvVar8 = std::
                                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                                        std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_460,&local_480,pvVar8);
                                        std::__cxx11::string::~string((string *)&local_480);
                                        AddFindDefinition(this,(string *)local_460,local_420);
                                        std::__cxx11::string::operator+=
                                                  ((string *)&components_sep,
                                                   (char *)requiredComponents._M_t._M_impl.
                                                           super__Rb_tree_header._M_node_count);
                                        pvVar8 = std::
                                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                                        std::__cxx11::string::operator+=
                                                  ((string *)&components_sep,(string *)pvVar8);
                                        requiredComponents._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count = (long)"\"$;" + 2;
                                        std::__cxx11::string::~string((string *)local_460);
                                      }
                                      else if ((int)version.searchstring == 3) {
                                        pvVar8 = std::
                                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                                        std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::push_back(&this->Names,pvVar8);
                                      }
                                      else if ((int)version.searchstring == 4) {
                                        pvVar8 = std::
                                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                                        std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::push_back(&(this->super_cmFindCommon).UserGuessArgs,pvVar8
                                                   );
                                      }
                                      else if ((int)version.searchstring == 7) {
                                        pvVar8 = std::
                                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                                        std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::push_back(&(this->super_cmFindCommon).UserHintsArgs,pvVar8
                                                   );
                                      }
                                      else if ((int)version.searchstring == 5) {
                                        pvVar8 = std::
                                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                                        cmFindCommon::AddPathSuffix
                                                  (&this->super_cmFindCommon,pvVar8);
                                      }
                                      else {
                                        if ((int)version.searchstring != 6) {
                                          if (!bVar3) {
                                            std::
                                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                                            pcVar7 = (char *)std::__cxx11::string::c_str();
                                            bVar3 = cmsys::RegularExpression::find
                                                              ((RegularExpression *)local_2e8,pcVar7
                                                              );
                                            if (bVar3) {
                                              bVar3 = true;
                                              pvVar8 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                                              std::__cxx11::string::operator=
                                                        ((string *)&this->Version,(string *)pvVar8);
                                              goto LAB_00736726;
                                            }
                                          }
                                          std::__cxx11::ostringstream::ostringstream
                                                    ((ostringstream *)local_7c0);
                                          poVar10 = std::operator<<((ostream *)local_7c0,
                                                                                                                                        
                                                  "called with invalid argument \"");
                                          pvVar8 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                                          poVar10 = std::operator<<(poVar10,(string *)pvVar8);
                                          std::operator<<(poVar10,"\"");
                                          std::__cxx11::ostringstream::str();
                                          cmCommand::SetError((cmCommand *)this,
                                                              (string *)
                                                              &doubledComponents.
                                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                          std::__cxx11::string::~string
                                                    ((string *)
                                                     &doubledComponents.
                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                          this_local._7_1_ = 0;
                                          std::__cxx11::ostringstream::~ostringstream
                                                    ((ostringstream *)local_7c0);
                                          goto LAB_00737cfc;
                                        }
                                        pvVar8 = std::
                                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                                        lVar9 = std::__cxx11::string::find_first_of
                                                          ((char *)pvVar8,0xa6e644);
                                        std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                                        local_12e1 = true;
                                        if (lVar9 == -1) {
                                          pvVar8 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                                          cmsys::SystemTools::GetFilenameLastExtension
                                                    (&local_4a0,pvVar8);
                                          local_12e1 = std::operator!=(&local_4a0,".cmake");
                                          std::__cxx11::string::~string((string *)&local_4a0);
                                        }
                                        if (local_12e1 != false) {
                                          std::__cxx11::ostringstream::ostringstream
                                                    ((ostringstream *)local_620);
                                          poVar10 = std::operator<<((ostream *)local_620,
                                                                                                                                        
                                                  "given CONFIGS option followed by invalid file name \""
                                                  );
                                          pvVar8 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                                          poVar10 = std::operator<<(poVar10,(string *)pvVar8);
                                          poVar10 = std::operator<<(poVar10,
                                                  "\".  The names given must be file names without "
                                                  );
                                          std::operator<<(poVar10,
                                                  "a path and with a \".cmake\" extension.");
                                          std::__cxx11::ostringstream::str();
                                          cmCommand::SetError((cmCommand *)this,&local_640);
                                          std::__cxx11::string::~string((string *)&local_640);
                                          this_local._7_1_ = 0;
                                          std::__cxx11::ostringstream::~ostringstream
                                                    ((ostringstream *)local_620);
                                          goto LAB_00737cfc;
                                        }
                                        pvVar8 = std::
                                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_3_local,(ulong)local_354);
                                        std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::push_back(&this->Configs,pvVar8);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00736726:
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_7f8);
  this_00 = &optionalComponents._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __first1 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_00);
  __last1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
  __first2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1f0);
  __last2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1f0);
  __result = std::
             back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_7f8);
  std::
  set_intersection<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__first1._M_node,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__last1._M_node,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__first2._M_node,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__last2._M_node,__result);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_7f8);
  if (bVar3) {
    bVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::empty
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &moduleArgs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    this->UseFindModules = bVar3;
    bVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::empty
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       local_350);
    this->UseConfigFiles = bVar3;
    if (((this->UseFindModules & 1U) == 0) && ((this->UseConfigFiles & 1U) == 0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&si);
      std::operator<<((ostream *)&si,"given options exclusive to Module mode:\n");
      local_bd8._M_node =
           (_Base_ptr)
           std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                     ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      local_350);
      while( true ) {
        si_1._M_node = (_Base_ptr)
                       std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)local_350);
        bVar3 = std::operator!=(&local_bd8,&si_1);
        if (!bVar3) break;
        poVar10 = std::operator<<((ostream *)&si,"  ");
        pcVar2 = param_3_local;
        puVar11 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&local_bd8);
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)pcVar2,(ulong)*puVar11);
        poVar10 = std::operator<<(poVar10,(string *)pvVar8);
        std::operator<<(poVar10,"\n");
        std::_Rb_tree_const_iterator<unsigned_int>::operator++(&local_bd8);
      }
      std::operator<<((ostream *)&si,"and options exclusive to Config mode:\n");
      local_be8._M_node =
           (_Base_ptr)
           std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                     ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      &moduleArgs._M_t._M_impl.super__Rb_tree_header._M_node_count);
      while( true ) {
        local_bf0._M_node =
             (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                       ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )&moduleArgs._M_t._M_impl.super__Rb_tree_header._M_node_count);
        bVar3 = std::operator!=(&local_be8,&local_bf0);
        if (!bVar3) break;
        poVar10 = std::operator<<((ostream *)&si,"  ");
        pcVar2 = param_3_local;
        puVar11 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&local_be8);
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)pcVar2,(ulong)*puVar11);
        poVar10 = std::operator<<(poVar10,(string *)pvVar8);
        std::operator<<(poVar10,"\n");
        std::_Rb_tree_const_iterator<unsigned_int>::operator++(&local_be8);
      }
      std::operator<<((ostream *)&si,"The options are incompatible.");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError((cmCommand *)this,&local_c10);
      std::__cxx11::string::~string((string *)&local_c10);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&si);
    }
    else {
      uVar12 = std::__cxx11::string::empty();
      if (((uVar12 & 1) != 0) && ((this->VersionExact & 1U) != 0)) {
        this->VersionExact = false;
        pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_c30,"Ignoring EXACT since no version is requested.",
                   (allocator *)(mod.field_2._M_local_buf + 0xf));
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_c30);
        std::__cxx11::string::~string((string *)&local_c30);
        std::allocator<char>::~allocator((allocator<char> *)(mod.field_2._M_local_buf + 0xf));
      }
      uVar12 = std::__cxx11::string::empty();
      if (((uVar12 & 1) != 0) || (uVar12 = std::__cxx11::string::empty(), (uVar12 & 1) != 0)) {
        std::__cxx11::string::string((string *)(ver.field_2._M_local_buf + 8),(string *)&this->Name)
        ;
        std::__cxx11::string::operator+=((string *)(ver.field_2._M_local_buf + 8),"_FIND_MODULE");
        bVar3 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,
                                 (string *)((long)&ver.field_2 + 8));
        if (bVar3) {
          uVar12 = std::__cxx11::string::empty();
          if ((uVar12 & 1) != 0) {
            std::__cxx11::string::string
                      ((string *)(exact.field_2._M_local_buf + 8),(string *)&this->Name);
            std::__cxx11::string::operator+=
                      ((string *)(exact.field_2._M_local_buf + 8),"_FIND_VERSION");
            pcVar7 = cmMakefile::GetSafeDefinition
                               ((this->super_cmFindCommon).super_cmCommand.Makefile,
                                (string *)((long)&exact.field_2 + 8));
            std::__cxx11::string::operator=((string *)&this->Version,pcVar7);
            std::__cxx11::string::string
                      ((string *)(components_var.field_2._M_local_buf + 8),(string *)&this->Name);
            std::__cxx11::string::operator+=
                      ((string *)(components_var.field_2._M_local_buf + 8),"_FIND_VERSION_EXACT");
            bVar3 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,
                                     (string *)((long)&components_var.field_2 + 8));
            this->VersionExact = bVar3;
            std::__cxx11::string::~string((string *)(components_var.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(exact.field_2._M_local_buf + 8));
          }
          uVar12 = std::__cxx11::string::empty();
          if ((uVar12 & 1) != 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &parsed_minor,&this->Name,"_FIND_COMPONENTS");
            pcVar7 = cmMakefile::GetSafeDefinition
                               ((this->super_cmFindCommon).super_cmCommand.Makefile,
                                (string *)&parsed_minor);
            std::__cxx11::string::operator=((string *)&components_sep,pcVar7);
            std::__cxx11::string::~string((string *)&parsed_minor);
          }
        }
        std::__cxx11::string::~string((string *)(ver.field_2._M_local_buf + 8));
      }
      uVar12 = std::__cxx11::string::empty();
      if ((uVar12 & 1) == 0) {
        uVar13 = std::__cxx11::string::c_str();
        uVar5 = __isoc99_sscanf(uVar13,"%u.%u.%u.%u",&parsed_patch,&parsed_tweak,
                                (undefined1 *)((long)&disableFindPackageVar.field_2 + 0xc),
                                (undefined1 *)((long)&disableFindPackageVar.field_2 + 8));
        this->VersionCount = uVar5;
        switch(this->VersionCount) {
        case 4:
          this->VersionTweak = disableFindPackageVar.field_2._8_4_;
        case 3:
          this->VersionPatch = disableFindPackageVar.field_2._12_4_;
        case 2:
          this->VersionMinor = parsed_tweak;
        case 1:
          this->VersionMajor = parsed_patch;
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_ce8,"CMAKE_DISABLE_FIND_PACKAGE_",&local_ce9);
      std::allocator<char>::~allocator((allocator<char> *)&local_ce9);
      std::__cxx11::string::operator+=((string *)local_ce8,(string *)&this->Name);
      bVar3 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,
                               (string *)local_ce8);
      if (bVar3) {
        if ((this->Required & 1U) == 0) {
          this_local._7_1_ = 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e68);
          poVar10 = std::operator<<((ostream *)local_e68,"for module ");
          poVar10 = std::operator<<(poVar10,(string *)&this->Name);
          poVar10 = std::operator<<(poVar10," called with REQUIRED, but ");
          poVar10 = std::operator<<(poVar10,(string *)local_ce8);
          std::operator<<(poVar10," is enabled. A REQUIRED package cannot be disabled.");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError((cmCommand *)this,(string *)local_e88);
          std::__cxx11::string::~string((string *)local_e88);
          this_local._7_1_ = 0;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e68);
        }
      }
      else {
        SetModuleVariables(this,(string *)&components_sep);
        if ((this->UseFindModules & 1U) == 0) {
LAB_00737474:
          bVar4 = false;
          bVar3 = false;
          local_1412 = false;
          if (((this->UseFindModules & 1U) != 0) &&
             (local_1412 = false, (this->UseConfigFiles & 1U) != 0)) {
            pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
            std::allocator<char>::allocator();
            bVar4 = true;
            std::__cxx11::string::string
                      ((string *)&local_eb0,"CMAKE_FIND_PACKAGE_WARN_NO_MODULE",&local_eb1);
            bVar3 = true;
            local_1412 = cmMakefile::IsOn(pcVar1,&local_eb0);
          }
          if (bVar3) {
            std::__cxx11::string::~string((string *)&local_eb0);
          }
          if (bVar4) {
            std::allocator<char>::~allocator((allocator<char> *)&local_eb1);
          }
          if (local_1412 != false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1030);
            if (this->RequiredCMakeVersion < 0x2ec09cd808) {
              poVar10 = std::operator<<((ostream *)local_1030,
                                        "find_package called without NO_MODULE option and no Find");
              poVar10 = std::operator<<(poVar10,(string *)&this->Name);
              poVar10 = std::operator<<(poVar10,
                                        ".cmake module is in CMAKE_MODULE_PATH.  Add NO_MODULE to exclusively request Config mode and search for a package configuration file provided by "
                                       );
              poVar10 = std::operator<<(poVar10,(string *)&this->Name);
              poVar10 = std::operator<<(poVar10," (");
              poVar10 = std::operator<<(poVar10,(string *)&this->Name);
              poVar10 = std::operator<<(poVar10,"Config.cmake or ");
              cmsys::SystemTools::LowerCase(&local_1070,&this->Name);
              poVar10 = std::operator<<(poVar10,(string *)&local_1070);
              poVar10 = std::operator<<(poVar10,"-config.cmake).  Otherwise make Find");
              poVar10 = std::operator<<(poVar10,(string *)&this->Name);
              std::operator<<(poVar10,".cmake available in CMAKE_MODULE_PATH.");
              std::__cxx11::string::~string((string *)&local_1070);
            }
            else {
              poVar10 = std::operator<<((ostream *)local_1030,
                                        "find_package called without either MODULE or CONFIG option and no Find"
                                       );
              poVar10 = std::operator<<(poVar10,(string *)&this->Name);
              poVar10 = std::operator<<(poVar10,
                                        ".cmake module is in CMAKE_MODULE_PATH.  Add MODULE to exclusively request Module mode and fail if Find"
                                       );
              poVar10 = std::operator<<(poVar10,(string *)&this->Name);
              poVar10 = std::operator<<(poVar10,
                                        ".cmake is missing.  Add CONFIG to exclusively request Config mode and search for a package configuration file provided by "
                                       );
              poVar10 = std::operator<<(poVar10,(string *)&this->Name);
              poVar10 = std::operator<<(poVar10," (");
              poVar10 = std::operator<<(poVar10,(string *)&this->Name);
              poVar10 = std::operator<<(poVar10,"Config.cmake or ");
              cmsys::SystemTools::LowerCase(&local_1050,&this->Name);
              poVar10 = std::operator<<(poVar10,(string *)&local_1050);
              std::operator<<(poVar10,"-config.cmake).  ");
              std::__cxx11::string::~string((string *)&local_1050);
            }
            std::operator<<((ostream *)local_1030,
                            "\n(Variable CMAKE_FIND_PACKAGE_WARN_NO_MODULE enabled this warning.)");
            pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
            std::__cxx11::ostringstream::str();
            cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)&ni);
            std::__cxx11::string::~string((string *)&ni);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1030);
          }
          std::__cxx11::string::operator=((string *)&this->Variable,(string *)&this->Name);
          std::__cxx11::string::operator+=((string *)&this->Variable,"_DIR");
          bVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(&this->Names);
          if (bVar3) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->Names,&this->Name);
          }
          bVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(&this->Configs);
          if (bVar3) {
            local_10a0._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->Names);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::__normal_iterator<std::__cxx11::string*>
                      ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        *)&local_1098,&local_10a0);
            while( true ) {
              config.field_2._8_8_ =
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&this->Names);
              bVar3 = __gnu_cxx::operator!=
                                (&local_1098,
                                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&config.field_2 + 8));
              if (!bVar3) break;
              pbVar14 = __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&local_1098);
              std::__cxx11::string::string((string *)local_10c8,(string *)pbVar14);
              std::__cxx11::string::operator+=((string *)local_10c8,"Config.cmake");
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&this->Configs,(value_type *)local_10c8);
              pbVar14 = __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&local_1098);
              cmsys::SystemTools::LowerCase
                        ((string *)
                         &ignored.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,pbVar14);
              this_01 = &ignored.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::operator=((string *)local_10c8,(string *)this_01);
              std::__cxx11::string::~string((string *)this_01);
              std::__cxx11::string::operator+=((string *)local_10c8,"-config.cmake");
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&this->Configs,(value_type *)local_10c8);
              std::__cxx11::string::~string((string *)local_10c8);
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_1098);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1100);
          cmFindCommon::GetIgnoredPaths
                    (&this->super_cmFindCommon,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1100);
          cmFindCommon::RerootPaths
                    (&this->super_cmFindCommon,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1100);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&this->IgnoredPaths);
          __first = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1100);
          __last = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_1100);
          std::
          set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::
          insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->IgnoredPaths,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__first._M_current,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__last._M_current);
          bVar3 = HandlePackageMode(this);
          AppendSuccessInformation(this);
          this_local._7_1_ = bVar3;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1100);
        }
        else {
          local_e89 = false;
          bVar3 = FindModule(this,&local_e89);
          if (bVar3) {
            if ((local_e89 & 1U) == 0) goto LAB_00737474;
            AppendSuccessInformation(this);
            this_local._7_1_ = 1;
          }
          else {
            AppendSuccessInformation(this);
            this_local._7_1_ = 0;
          }
        }
      }
      std::__cxx11::string::~string((string *)local_ce8);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9a0);
    std::operator<<((ostream *)local_9a0,
                    "called with components that are both required and optional:\n");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9e0,"  ",&local_9e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a08,"",&local_a09);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a30,"\n",&local_a31);
    cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_9c0,&local_9e0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_7f8,&local_a08,&local_a30);
    poVar10 = std::operator<<((ostream *)local_9a0,(string *)&local_9c0);
    std::operator<<(poVar10,"\n");
    std::__cxx11::string::~string((string *)&local_9c0);
    std::__cxx11::string::~string((string *)&local_a30);
    std::allocator<char>::~allocator((allocator<char> *)&local_a31);
    std::__cxx11::string::~string((string *)&local_a08);
    std::allocator<char>::~allocator((allocator<char> *)&local_a09);
    std::__cxx11::string::~string((string *)&local_9e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
    std::__cxx11::ostringstream::str();
    cmCommand::SetError((cmCommand *)this,&local_a58);
    std::__cxx11::string::~string((string *)&local_a58);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9a0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_7f8);
LAB_00737cfc:
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_350)
  ;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &moduleArgs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_2e8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1f0);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&optionalComponents._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&components_sep);
LAB_00737d90:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFindPackageCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // Lookup required version of CMake.
  if(const char* rv =
     this->Makefile->GetDefinition("CMAKE_MINIMUM_REQUIRED_VERSION"))
    {
    unsigned int v[3] = {0,0,0};
    sscanf(rv, "%u.%u.%u", &v[0], &v[1], &v[2]);
    this->RequiredCMakeVersion = CMake_VERSION_ENCODE(v[0],v[1],v[2]);
    }

  // Check for debug mode.
  this->DebugMode = this->Makefile->IsOn("CMAKE_FIND_DEBUG_MODE");

  // Lookup target architecture, if any.
  if(const char* arch =
     this->Makefile->GetDefinition("CMAKE_LIBRARY_ARCHITECTURE"))
    {
    this->LibraryArchitecture = arch;
    }

  // Lookup whether lib64 paths should be used.
  if(this->Makefile->PlatformIs64Bit() &&
     this->Makefile->GetState()
         ->GetGlobalPropertyAsBool("FIND_LIBRARY_USE_LIB64_PATHS"))
    {
    this->UseLib64Paths = true;
    }

  // Check if User Package Registry should be disabled
  if(this->Makefile->IsOn("CMAKE_FIND_PACKAGE_NO_PACKAGE_REGISTRY"))
    {
    this->NoUserRegistry = true;
    }

  // Check if System Package Registry should be disabled
  if(this->Makefile->IsOn("CMAKE_FIND_PACKAGE_NO_SYSTEM_PACKAGE_REGISTRY"))
    {
    this->NoSystemRegistry = true;
    }

  // Find the current root path mode.
  this->SelectDefaultRootPathMode();

  // Find the current bundle/framework search policy.
  this->SelectDefaultMacMode();

  // Record options.
  this->Name = args[0];
  std::string components;
  const char* components_sep = "";
  std::set<std::string> requiredComponents;
  std::set<std::string> optionalComponents;

  // Always search directly in a generated path.
  this->SearchPathSuffixes.push_back("");

  // Parse the arguments.
  enum Doing { DoingNone, DoingComponents, DoingOptionalComponents, DoingNames,
               DoingPaths, DoingPathSuffixes, DoingConfigs, DoingHints };
  Doing doing = DoingNone;
  cmsys::RegularExpression version("^[0-9.]+$");
  bool haveVersion = false;
  std::set<unsigned int> configArgs;
  std::set<unsigned int> moduleArgs;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "QUIET")
      {
      this->Quiet = true;
      doing = DoingNone;
      }
    else if(args[i] == "EXACT")
      {
      this->VersionExact = true;
      doing = DoingNone;
      }
    else if(args[i] == "MODULE")
      {
      moduleArgs.insert(i);
      doing = DoingNone;
      }
    else if(args[i] == "CONFIG")
      {
      configArgs.insert(i);
      doing = DoingNone;
      }
    else if(args[i] == "NO_MODULE")
      {
      configArgs.insert(i);
      doing = DoingNone;
      }
    else if(args[i] == "REQUIRED")
      {
      this->Required = true;
      doing = DoingComponents;
      }
    else if(args[i] == "COMPONENTS")
      {
      doing = DoingComponents;
      }
    else if(args[i] == "OPTIONAL_COMPONENTS")
      {
      doing = DoingOptionalComponents;
      }
    else if(args[i] == "NAMES")
      {
      configArgs.insert(i);
      doing = DoingNames;
      }
    else if(args[i] == "PATHS")
      {
      configArgs.insert(i);
      doing = DoingPaths;
      }
    else if(args[i] == "HINTS")
      {
      configArgs.insert(i);
      doing = DoingHints;
      }
    else if(args[i] == "PATH_SUFFIXES")
      {
      configArgs.insert(i);
      doing = DoingPathSuffixes;
      }
    else if(args[i] == "CONFIGS")
      {
      configArgs.insert(i);
      doing = DoingConfigs;
      }
    else if(args[i] == "NO_POLICY_SCOPE")
      {
      this->PolicyScope = false;
      doing = DoingNone;
      }
    else if(args[i] == "NO_CMAKE_PACKAGE_REGISTRY")
      {
      this->NoUserRegistry = true;
      configArgs.insert(i);
      doing = DoingNone;
      }
    else if(args[i] == "NO_CMAKE_SYSTEM_PACKAGE_REGISTRY")
      {
      this->NoSystemRegistry = true;
      configArgs.insert(i);
      doing = DoingNone;
      }
    else if(args[i] == "NO_CMAKE_BUILDS_PATH")
      {
      // Ignore legacy option.
      configArgs.insert(i);
      doing = DoingNone;
      }
    else if(this->CheckCommonArgument(args[i]))
      {
      configArgs.insert(i);
      doing = DoingNone;
      }
    else if((doing == DoingComponents) || (doing == DoingOptionalComponents))
      {
      // Set a variable telling the find script whether this component
      // is required.
      const char* isRequired = "1";
      if (doing == DoingOptionalComponents)
        {
        isRequired = "0";
        optionalComponents.insert(args[i]);
        }
      else
        {
        requiredComponents.insert(args[i]);
        }

      std::string req_var = this->Name + "_FIND_REQUIRED_" + args[i];
      this->AddFindDefinition(req_var, isRequired);

      // Append to the list of required components.
      components += components_sep;
      components += args[i];
      components_sep = ";";
      }
    else if(doing == DoingNames)
      {
      this->Names.push_back(args[i]);
      }
    else if(doing == DoingPaths)
      {
      this->UserGuessArgs.push_back(args[i]);
      }
    else if(doing == DoingHints)
      {
      this->UserHintsArgs.push_back(args[i]);
      }
    else if(doing == DoingPathSuffixes)
      {
      this->AddPathSuffix(args[i]);
      }
    else if(doing == DoingConfigs)
      {
      if(args[i].find_first_of(":/\\") != args[i].npos ||
         cmSystemTools::GetFilenameLastExtension(args[i]) != ".cmake")
        {
        std::ostringstream e;
        e << "given CONFIGS option followed by invalid file name \""
          << args[i] << "\".  The names given must be file names without "
          << "a path and with a \".cmake\" extension.";
        this->SetError(e.str());
        return false;
        }
      this->Configs.push_back(args[i]);
      }
    else if(!haveVersion && version.find(args[i].c_str()))
      {
      haveVersion = true;
      this->Version = args[i];
      }
    else
      {
      std::ostringstream e;
      e << "called with invalid argument \"" << args[i] << "\"";
      this->SetError(e.str());
      return false;
      }
    }

  std::vector<std::string> doubledComponents;
  std::set_intersection(requiredComponents.begin(), requiredComponents.end(),
                        optionalComponents.begin(), optionalComponents.end(),
                        std::back_inserter(doubledComponents));
  if(!doubledComponents.empty())
    {
    std::ostringstream e;
    e << "called with components that are both required and optional:\n";
    e << cmWrap("  ", doubledComponents, "", "\n") << "\n";
    this->SetError(e.str());
    return false;
    }

  // Maybe choose one mode exclusively.
  this->UseFindModules = configArgs.empty();
  this->UseConfigFiles = moduleArgs.empty();
  if(!this->UseFindModules && !this->UseConfigFiles)
    {
    std::ostringstream e;
    e << "given options exclusive to Module mode:\n";
    for(std::set<unsigned int>::const_iterator si = moduleArgs.begin();
        si != moduleArgs.end(); ++si)
      {
      e << "  " << args[*si] << "\n";
      }
    e << "and options exclusive to Config mode:\n";
    for(std::set<unsigned int>::const_iterator si = configArgs.begin();
        si != configArgs.end(); ++si)
      {
      e << "  " << args[*si] << "\n";
      }
    e << "The options are incompatible.";
    this->SetError(e.str());
    return false;
    }

  // Ignore EXACT with no version.
  if(this->Version.empty() && this->VersionExact)
    {
    this->VersionExact = false;
    this->Makefile->IssueMessage(
      cmake::AUTHOR_WARNING, "Ignoring EXACT since no version is requested.");
    }

  if(this->Version.empty() || components.empty())
    {
    // Check whether we are recursing inside "Find<name>.cmake" within
    // another find_package(<name>) call.
    std::string mod = this->Name;
    mod += "_FIND_MODULE";
    if(this->Makefile->IsOn(mod))
      {
      if(this->Version.empty())
        {
        // Get version information from the outer call if necessary.
        // Requested version string.
        std::string ver = this->Name;
        ver += "_FIND_VERSION";
        this->Version = this->Makefile->GetSafeDefinition(ver);

        // Whether an exact version is required.
        std::string exact = this->Name;
        exact += "_FIND_VERSION_EXACT";
        this->VersionExact = this->Makefile->IsOn(exact);
        }
      if(components.empty())
        {
        std::string components_var = this->Name + "_FIND_COMPONENTS";
        components = this->Makefile->GetSafeDefinition(components_var);
        }
      }
    }

  if(!this->Version.empty())
    {
    // Try to parse the version number and store the results that were
    // successfully parsed.
    unsigned int parsed_major;
    unsigned int parsed_minor;
    unsigned int parsed_patch;
    unsigned int parsed_tweak;
    this->VersionCount = sscanf(this->Version.c_str(), "%u.%u.%u.%u",
                                &parsed_major, &parsed_minor,
                                &parsed_patch, &parsed_tweak);
    switch(this->VersionCount)
      {
      case 4: this->VersionTweak = parsed_tweak; // no break!
      case 3: this->VersionPatch = parsed_patch; // no break!
      case 2: this->VersionMinor = parsed_minor; // no break!
      case 1: this->VersionMajor = parsed_major; // no break!
      default: break;
      }
    }

  std::string disableFindPackageVar = "CMAKE_DISABLE_FIND_PACKAGE_";
  disableFindPackageVar += this->Name;
  if(this->Makefile->IsOn(disableFindPackageVar))
    {
    if (this->Required)
      {
      std::ostringstream e;
      e << "for module " << this->Name << " called with REQUIRED, but "
        << disableFindPackageVar
        << " is enabled. A REQUIRED package cannot be disabled.";
      this->SetError(e.str());
      return false;
      }

    return true;
    }


  this->SetModuleVariables(components);

  // See if there is a Find<package>.cmake module.
  if(this->UseFindModules)
    {
    bool foundModule = false;
    if(!this->FindModule(foundModule))
      {
      this->AppendSuccessInformation();
      return false;
      }
    if(foundModule)
      {
      this->AppendSuccessInformation();
      return true;
      }
    }

  if(this->UseFindModules && this->UseConfigFiles &&
     this->Makefile->IsOn("CMAKE_FIND_PACKAGE_WARN_NO_MODULE"))
    {
    std::ostringstream aw;
    if(this->RequiredCMakeVersion >= CMake_VERSION_ENCODE(2,8,8))
      {
      aw << "find_package called without either MODULE or CONFIG option and "
        "no Find" << this->Name << ".cmake module is in CMAKE_MODULE_PATH.  "
        "Add MODULE to exclusively request Module mode and fail if "
        "Find" << this->Name << ".cmake is missing.  "
        "Add CONFIG to exclusively request Config mode and search for a "
        "package configuration file provided by " << this->Name <<
        " (" << this->Name << "Config.cmake or " <<
        cmSystemTools::LowerCase(this->Name) << "-config.cmake).  ";
      }
    else
      {
      aw << "find_package called without NO_MODULE option and no "
        "Find" << this->Name << ".cmake module is in CMAKE_MODULE_PATH.  "
        "Add NO_MODULE to exclusively request Config mode and search for a "
        "package configuration file provided by " << this->Name <<
        " (" << this->Name << "Config.cmake or " <<
        cmSystemTools::LowerCase(this->Name) << "-config.cmake).  "
        "Otherwise make Find" << this->Name << ".cmake available in "
        "CMAKE_MODULE_PATH.";
      }
    aw << "\n"
      "(Variable CMAKE_FIND_PACKAGE_WARN_NO_MODULE enabled this warning.)";
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, aw.str());
    }

  // No find module.  Assume the project has a CMake config file.  Use
  // a <package>_DIR cache variable to locate it.
  this->Variable = this->Name;
  this->Variable += "_DIR";

  // Add the default name.
  if(this->Names.empty())
    {
    this->Names.push_back(this->Name);
    }

  // Add the default configs.
  if(this->Configs.empty())
    {
    for(std::vector<std::string>::const_iterator ni = this->Names.begin();
        ni != this->Names.end(); ++ni)
      {
      std::string config = *ni;
      config += "Config.cmake";
      this->Configs.push_back(config);

      config = cmSystemTools::LowerCase(*ni);
      config += "-config.cmake";
      this->Configs.push_back(config);
      }
    }

  // get igonored paths from vars and reroot them.
  std::vector<std::string> ignored;
  this->GetIgnoredPaths(ignored);
  this->RerootPaths(ignored);

  // Construct a set of ignored paths
  this->IgnoredPaths.clear();
  this->IgnoredPaths.insert(ignored.begin(), ignored.end());

  // Find and load the package.
  bool result = this->HandlePackageMode();
  this->AppendSuccessInformation();
  return result;
}